

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawList::_ResetForNewFrame(ImDrawList *this)

{
  ImWchar *__src;
  ImDrawVert *__src_00;
  ImVec4 *__src_01;
  void **__src_02;
  ImVec2 *__src_03;
  int iVar1;
  ImDrawCmd *pIVar2;
  ImWchar *__dest;
  ImDrawVert *__dest_00;
  ImVec4 *__dest_01;
  void **__dest_02;
  ImVec2 *__dest_03;
  ImDrawCmd *pIVar3;
  int iVar4;
  int iVar5;
  
  if ((this->CmdBuffer).Capacity < 0) {
    pIVar2 = (ImDrawCmd *)ImGui::MemAlloc(0);
    pIVar3 = (this->CmdBuffer).Data;
    if (pIVar3 != (ImDrawCmd *)0x0) {
      memcpy(pIVar2,pIVar3,(long)(this->CmdBuffer).Size * 0x38);
      ImGui::MemFree((this->CmdBuffer).Data);
    }
    (this->CmdBuffer).Data = pIVar2;
    (this->CmdBuffer).Capacity = 0;
  }
  (this->CmdBuffer).Size = 0;
  if ((this->IdxBuffer).Capacity < L'\0') {
    __dest = (ImWchar *)ImGui::MemAlloc(0);
    __src = (this->IdxBuffer).Data;
    if (__src != (ImWchar *)0x0) {
      memcpy(__dest,__src,(long)(this->IdxBuffer).Size * 2);
      ImGui::MemFree((this->IdxBuffer).Data);
    }
    (this->IdxBuffer).Data = __dest;
    (this->IdxBuffer).Capacity = L'\0';
  }
  (this->IdxBuffer).Size = L'\0';
  if ((this->VtxBuffer).Capacity < 0) {
    __dest_00 = (ImDrawVert *)ImGui::MemAlloc(0);
    __src_00 = (this->VtxBuffer).Data;
    if (__src_00 != (ImDrawVert *)0x0) {
      memcpy(__dest_00,__src_00,(long)(this->VtxBuffer).Size * 0x14);
      ImGui::MemFree((this->VtxBuffer).Data);
    }
    (this->VtxBuffer).Data = __dest_00;
    (this->VtxBuffer).Capacity = 0;
  }
  (this->VtxBuffer).Size = 0;
  this->Flags = this->_Data->InitialFlags;
  (this->_CmdHeader).ClipRect.x = 0.0;
  (this->_CmdHeader).ClipRect.y = 0.0;
  (this->_CmdHeader).ClipRect.z = 0.0;
  (this->_CmdHeader).ClipRect.w = 0.0;
  (this->_CmdHeader).TextureId = (ImTextureID)0x0;
  *(undefined8 *)&(this->_CmdHeader).VtxOffset = 0;
  this->_VtxCurrentIdx = 0;
  this->_VtxWritePtr = (ImDrawVert *)0x0;
  this->_IdxWritePtr = (ImDrawIdx *)0x0;
  if ((this->_ClipRectStack).Capacity < 0) {
    __dest_01 = (ImVec4 *)ImGui::MemAlloc(0);
    __src_01 = (this->_ClipRectStack).Data;
    if (__src_01 != (ImVec4 *)0x0) {
      memcpy(__dest_01,__src_01,(long)(this->_ClipRectStack).Size << 4);
      ImGui::MemFree((this->_ClipRectStack).Data);
    }
    (this->_ClipRectStack).Data = __dest_01;
    (this->_ClipRectStack).Capacity = 0;
  }
  (this->_ClipRectStack).Size = 0;
  if ((this->_TextureIdStack).Capacity < 0) {
    __dest_02 = (void **)ImGui::MemAlloc(0);
    __src_02 = (this->_TextureIdStack).Data;
    if (__src_02 != (void **)0x0) {
      memcpy(__dest_02,__src_02,(long)(this->_TextureIdStack).Size << 3);
      ImGui::MemFree((this->_TextureIdStack).Data);
    }
    (this->_TextureIdStack).Data = __dest_02;
    (this->_TextureIdStack).Capacity = 0;
  }
  (this->_TextureIdStack).Size = 0;
  if ((this->_Path).Capacity < 0) {
    __dest_03 = (ImVec2 *)ImGui::MemAlloc(0);
    __src_03 = (this->_Path).Data;
    if (__src_03 != (ImVec2 *)0x0) {
      memcpy(__dest_03,__src_03,(long)(this->_Path).Size << 3);
      ImGui::MemFree((this->_Path).Data);
    }
    (this->_Path).Data = __dest_03;
    (this->_Path).Capacity = 0;
  }
  (this->_Path).Size = 0;
  (this->_Splitter)._Current = 0;
  (this->_Splitter)._Count = 1;
  iVar1 = (this->CmdBuffer).Size;
  if (iVar1 == (this->CmdBuffer).Capacity) {
    if (iVar1 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar1 / 2 + iVar1;
    }
    iVar5 = iVar1 + 1;
    if (iVar1 + 1 < iVar4) {
      iVar5 = iVar4;
    }
    pIVar3 = (ImDrawCmd *)ImGui::MemAlloc((long)iVar5 * 0x38);
    pIVar2 = (this->CmdBuffer).Data;
    if (pIVar2 != (ImDrawCmd *)0x0) {
      memcpy(pIVar3,pIVar2,(long)(this->CmdBuffer).Size * 0x38);
      ImGui::MemFree((this->CmdBuffer).Data);
    }
    (this->CmdBuffer).Data = pIVar3;
    (this->CmdBuffer).Capacity = iVar5;
    iVar1 = (this->CmdBuffer).Size;
  }
  else {
    pIVar3 = (this->CmdBuffer).Data;
  }
  *(undefined8 *)&pIVar3[iVar1].ElemCount = 0;
  *(ImDrawCallback *)(&pIVar3[iVar1].ElemCount + 2) = (ImDrawCallback)0x0;
  pIVar3[iVar1].TextureId = (ImTextureID)0x0;
  (&pIVar3[iVar1].TextureId)[1] = (ImTextureID)0x0;
  pIVar2 = pIVar3 + iVar1;
  (pIVar2->ClipRect).x = 0.0;
  (pIVar2->ClipRect).y = 0.0;
  (pIVar2->ClipRect).z = 0.0;
  (pIVar2->ClipRect).w = 0.0;
  pIVar3[iVar1].UserCallbackData = (void *)0x0;
  (this->CmdBuffer).Size = (this->CmdBuffer).Size + 1;
  this->_FringeScale = 1.0;
  return;
}

Assistant:

void ImDrawList::_ResetForNewFrame()
{
    // Verify that the ImDrawCmd fields we want to memcmp() are contiguous in memory.
    // (those should be IM_STATIC_ASSERT() in theory but with our pre C++11 setup the whole check doesn't compile with GCC)
    IM_ASSERT(IM_OFFSETOF(ImDrawCmd, ClipRect) == 0);
    IM_ASSERT(IM_OFFSETOF(ImDrawCmd, TextureId) == sizeof(ImVec4));
    IM_ASSERT(IM_OFFSETOF(ImDrawCmd, VtxOffset) == sizeof(ImVec4) + sizeof(ImTextureID));

    CmdBuffer.resize(0);
    IdxBuffer.resize(0);
    VtxBuffer.resize(0);
    Flags = _Data->InitialFlags;
    memset(&_CmdHeader, 0, sizeof(_CmdHeader));
    _VtxCurrentIdx = 0;
    _VtxWritePtr = NULL;
    _IdxWritePtr = NULL;
    _ClipRectStack.resize(0);
    _TextureIdStack.resize(0);
    _Path.resize(0);
    _Splitter.Clear();
    CmdBuffer.push_back(ImDrawCmd());
    _FringeScale = 1.0f;
}